

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::accessChainPushSwizzle
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle,
          Id preSwizzleBaseType,CoherentFlags coherentFlags,uint alignment)

{
  uint *puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer puVar2;
  ulong uVar3;
  uint uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oldSwizzle;
  CoherentFlags local_44;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  local_44 = coherentFlags;
  AccessChain::CoherentFlags::operator|=(&(this->accessChain).coherentFlags,&local_44);
  puVar1 = &(this->accessChain).alignment;
  *puVar1 = *puVar1 | alignment;
  if ((this->accessChain).preSwizzleBaseType == 0) {
    (this->accessChain).preSwizzleBaseType = preSwizzleBaseType;
  }
  this_00 = &(this->accessChain).swizzle;
  if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,swizzle);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,this_00);
    uVar4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,0);
    while( true ) {
      puVar2 = (swizzle->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(swizzle->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
          (ulong)uVar4) break;
      uVar3 = (ulong)puVar2[uVar4];
      if ((ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) {
        __assert_fail("swizzle[i] < oldSwizzle.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xf7a,
                      "void spv::Builder::accessChainPushSwizzle(std::vector<unsigned int> &, Id, AccessChain::CoherentFlags, unsigned int)"
                     );
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this_00,local_40._M_impl.super__Vector_impl_data._M_start + uVar3);
      uVar4 = uVar4 + 1;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  }
  simplifyAccessChainSwizzle(this);
  return;
}

Assistant:

void Builder::accessChainPushSwizzle(std::vector<unsigned>& swizzle, Id preSwizzleBaseType,
    AccessChain::CoherentFlags coherentFlags, unsigned int alignment)
{
    accessChain.coherentFlags |= coherentFlags;
    accessChain.alignment |= alignment;

    // swizzles can be stacked in GLSL, but simplified to a single
    // one here; the base type doesn't change
    if (accessChain.preSwizzleBaseType == NoType)
        accessChain.preSwizzleBaseType = preSwizzleBaseType;

    // if needed, propagate the swizzle for the current access chain
    if (accessChain.swizzle.size() > 0) {
        std::vector<unsigned> oldSwizzle = accessChain.swizzle;
        accessChain.swizzle.resize(0);
        for (unsigned int i = 0; i < swizzle.size(); ++i) {
            assert(swizzle[i] < oldSwizzle.size());
            accessChain.swizzle.push_back(oldSwizzle[swizzle[i]]);
        }
    } else
        accessChain.swizzle = swizzle;

    // determine if we need to track this swizzle anymore
    simplifyAccessChainSwizzle();
}